

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestUnpackWithTypeMismatch_Test::TestBody
          (AnyTest_TestUnpackWithTypeMismatch_Test *this)

{
  bool bVar1;
  Message *in_R8;
  char *in_R9;
  string_view type_url;
  Any any;
  TestAny payload;
  TestAllTypes dest;
  AssertHelper local_400;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3f8;
  internal local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  string local_3e0;
  Any local_3c0;
  TestAny local_398;
  TestAllTypes local_350;
  
  proto2_unittest::TestAny::TestAny(&local_398,(Arena *)0x0);
  local_398.field_0._impl_.int32_value_ = 0xd;
  local_398.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_398.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  Any::Any(&local_3c0,(Arena *)0x0);
  Any::PackFrom(&local_3c0,&local_398.super_Message);
  proto2_unittest::TestAllTypes::TestAllTypes(&local_350,(Arena *)0x0);
  type_url._M_str =
       (char *)((ulong)local_3c0.field_0._impl_.value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  type_url._M_len =
       *(size_t *)((ulong)local_3c0.field_0._impl_.type_url_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  bVar1 = protobuf::internal::InternalUnpackTo
                    ((internal *)
                     ((size_t *)
                     ((ulong)local_3c0.field_0._impl_.type_url_.tagged_ptr_.ptr_ &
                     0xfffffffffffffffc))[1],type_url,(ValueType *)&local_350,in_R8);
  local_3f0[0] = (internal)!bVar1;
  local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e0,local_3f0,(AssertionResult *)"any.UnpackTo(&dest)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x3d,local_3e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if (local_3f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3f8._M_head_impl + 8))();
    }
    if (local_3e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3e8,local_3e8);
    }
  }
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_350);
  Any::~Any(&local_3c0);
  proto2_unittest::TestAny::~TestAny(&local_398);
  return;
}

Assistant:

TEST(AnyTest, TestUnpackWithTypeMismatch) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(13);
  google::protobuf::Any any;
  any.PackFrom(payload);

  // Attempt to unpack into the wrong type.
  proto2_unittest::TestAllTypes dest;
  EXPECT_FALSE(any.UnpackTo(&dest));
}